

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::DataParameter::ByteSizeLong(DataParameter *this)

{
  int iVar1;
  uint uVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = DataParameter::unknown_fields(this);
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize((this->source_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize((this->mean_file_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      uVar4 = this->batch_size_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar2 & 8) != 0) {
      uVar4 = this->crop_size_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar2 & 0x10) != 0) {
      uVar4 = this->rand_skip_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    sVar5 = ((uVar2 >> 5 & 2) + (uVar2 >> 4 & 2)) + sVar5;
    if ((char)uVar2 < '\0') {
      sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->backend_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar2 & 0x300) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      sVar5 = sVar5 + 5;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      uVar2 = this->prefetch_ | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t DataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.DataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string source = 1;
    if (has_source()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string mean_file = 3;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional uint32 batch_size = 4;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 crop_size = 5 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional uint32 rand_skip = 7 [default = 0];
    if (has_rand_skip()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->rand_skip());
    }

    // optional bool mirror = 6 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool force_encoded_color = 9 [default = false];
    if (has_force_encoded_color()) {
      total_size += 1 + 1;
    }

    // optional .caffe.DataParameter.DB backend = 8 [default = LEVELDB];
    if (has_backend()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->backend());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

    // optional uint32 prefetch = 10 [default = 4];
    if (has_prefetch()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->prefetch());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}